

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall Lib::Stack<char>::expand(Stack<char> *this)

{
  char *pcVar1;
  char *pcVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  
  sVar5 = 8;
  if (this->_capacity != 0) {
    sVar5 = this->_capacity * 2;
  }
  uVar4 = sVar5 + 0xf & 0xfffffffffffffff0;
  if (uVar4 == 0) {
    pcVar2 = (char *)FixedSizeAllocator<8UL>::alloc
                               ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar4 < 0x11) {
    pcVar2 = (char *)FixedSizeAllocator<16UL>::alloc
                               ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar4 < 0x19) {
    pcVar2 = (char *)FixedSizeAllocator<24UL>::alloc
                               ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar4 < 0x21) {
    pcVar2 = (char *)FixedSizeAllocator<32UL>::alloc
                               ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar4 < 0x31) {
    pcVar2 = (char *)FixedSizeAllocator<48UL>::alloc
                               ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar4 < 0x41) {
    pcVar2 = (char *)FixedSizeAllocator<64UL>::alloc
                               ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pcVar2 = (char *)::operator_new(uVar4,0x10);
  }
  if (this->_capacity == 0) {
    uVar4 = 0;
  }
  else {
    uVar3 = 0;
    do {
      pcVar2[uVar3] = this->_stack[uVar3];
      uVar3 = uVar3 + 1;
      uVar4 = this->_capacity;
    } while (uVar3 < uVar4);
    pcVar1 = this->_stack;
    if (pcVar1 != (char *)0x0) {
      uVar3 = uVar4 + 0xf & 0xfffffffffffffff0;
      if (uVar3 == 0) {
        *(undefined8 *)pcVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pcVar1;
      }
      else if (uVar3 < 0x11) {
        *(undefined8 *)pcVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pcVar1;
      }
      else if (uVar3 < 0x19) {
        *(undefined8 *)pcVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pcVar1;
      }
      else if (uVar3 < 0x21) {
        *(undefined8 *)pcVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pcVar1;
      }
      else if (uVar3 < 0x31) {
        *(undefined8 *)pcVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pcVar1;
      }
      else if (uVar3 < 0x41) {
        *(undefined8 *)pcVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pcVar1;
      }
      else {
        operator_delete(pcVar1,0x10);
        uVar4 = this->_capacity;
      }
    }
  }
  this->_stack = pcVar2;
  this->_cursor = pcVar2 + uVar4;
  this->_end = pcVar2 + sVar5;
  this->_capacity = sVar5;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }